

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall embree::SceneGraph::GroupNode::resetInDegree(GroupNode *this)

{
  pointer pRVar1;
  size_t sVar2;
  Ref<embree::SceneGraph::Node> *c;
  pointer pRVar3;
  
  (this->super_Node).closed = false;
  sVar2 = (this->super_Node).indegree;
  if (sVar2 == 1) {
    pRVar1 = (this->children).
             super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pRVar3 = (this->children).
                  super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pRVar3 != pRVar1; pRVar3 = pRVar3 + 1)
    {
      (*(pRVar3->ptr->super_RefCount)._vptr_RefCount[8])();
    }
    sVar2 = (this->super_Node).indegree;
  }
  (this->super_Node).indegree = sVar2 - 1;
  return;
}

Assistant:

void SceneGraph::GroupNode::resetInDegree()
  {
    closed = false;
    if (indegree == 1) {
      for (auto&  c : children)
        c->resetInDegree();
    }
    indegree--;
  }